

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

string_t duckdb::NumericHelper::FormatSigned<unsigned_char>(uchar value,Vector *vector)

{
  int iVar1;
  ulong uVar2;
  idx_t len;
  undefined1 *puVar3;
  string_t sVar4;
  string_t result;
  undefined1 local_28 [16];
  
  iVar1 = UnsignedLength<unsigned_char>(value);
  local_28 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)vector,(Vector *)(long)iVar1,len);
  puVar3 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    puVar3 = local_28 + 4;
  }
  FormatUnsigned<unsigned_char>(value,puVar3 + (long)&((Vector *)(long)iVar1)->vector_type);
  uVar2 = (ulong)(uint)local_28._0_4_;
  if (uVar2 < 0xd) {
    switchD_00569a20::default(local_28 + 4 + uVar2,0,0xc - uVar2);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  sVar4.value.pointer.ptr = (char *)local_28._8_8_;
  sVar4.value._0_8_ = local_28._0_8_;
  return (string_t)sVar4.value;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}